

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

void __thiscall QPDF::swapObjects(QPDF *this,QPDFObjGen og1,QPDFObjGen og2)

{
  pointer pMVar1;
  mapped_type *pmVar2;
  element_type *this_00;
  shared_ptr<QPDFObject> local_40;
  QPDF *local_30;
  QPDFObjGen local_28;
  QPDF *local_20;
  QPDF *this_local;
  QPDFObjGen og2_local;
  QPDFObjGen og1_local;
  
  local_28 = og1;
  local_20 = this;
  this_local = (QPDF *)og2;
  og2_local = og1;
  resolve(this,og1);
  local_30 = this_local;
  resolve(this,(QPDFObjGen)this_local);
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pmVar2 = std::
           map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
           ::operator[](&pMVar1->obj_cache,&og2_local);
  this_00 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       pmVar2);
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pmVar2 = std::
           map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
           ::operator[](&pMVar1->obj_cache,(key_type *)&this_local);
  std::shared_ptr<QPDFObject>::shared_ptr(&local_40,&pmVar2->object);
  QPDFObject::swapWith(this_00,&local_40);
  std::shared_ptr<QPDFObject>::~shared_ptr(&local_40);
  return;
}

Assistant:

void
QPDF::swapObjects(QPDFObjGen og1, QPDFObjGen og2)
{
    // Force objects to be read from the input source if needed, then swap them in the cache.
    resolve(og1);
    resolve(og2);
    m->obj_cache[og1].object->swapWith(m->obj_cache[og2].object);
}